

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_server_main.cpp
# Opt level: O1

void __thiscall settings::settings(settings *this,int argc,char **argv)

{
  value *this_00;
  copyable acStack_38 [8];
  
  (this->ip)._M_dataplus._M_p = (pointer)&(this->ip).field_2;
  (this->ip)._M_string_length = 0;
  (this->ip).field_2._M_local_buf[0] = '\0';
  this_00 = &this->config;
  cppcms::json::value::copyable::copyable(&this_00->d);
  (this->sessions).
  super___shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->sessions).
  super___shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  booster::shared_object::shared_object(&this->plugin);
  (this->cache).p_ = (base_cache *)0x0;
  cppcms::service::load_settings((int)acStack_38,(char **)(ulong)(uint)argc);
  cppcms::json::value::copyable::operator=(&this_00->d,acStack_38);
  cppcms::json::value::copyable::~copyable(acStack_38);
  setup(this,this_00);
  return;
}

Assistant:

settings(int argc,char **argv)
	{
		try {
			config = cppcms::service::load_settings(argc,argv);
			setup(config);
		}
		catch(cppcms::cppcms_error const &) {
			help();
			throw;
		}
	}